

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UBool __thiscall
icu_63::ReorderingBuffer::appendZeroCC
          (ReorderingBuffer *this,UChar *s,UChar *sLimit,UErrorCode *errorCode)

{
  UBool UVar1;
  int appendLength;
  int32_t length;
  UErrorCode *errorCode_local;
  UChar *sLimit_local;
  UChar *s_local;
  ReorderingBuffer *this_local;
  
  if (s != sLimit) {
    appendLength = (int)((long)sLimit - (long)s >> 1);
    if ((this->remainingCapacity < appendLength) &&
       (UVar1 = resize(this,appendLength,errorCode), UVar1 == '\0')) {
      return '\0';
    }
    u_memcpy_63(this->limit,s,appendLength);
    this->limit = this->limit + appendLength;
    this->remainingCapacity = this->remainingCapacity - appendLength;
    this->lastCC = '\0';
    this->reorderStart = this->limit;
  }
  return '\x01';
}

Assistant:

UBool ReorderingBuffer::appendZeroCC(const UChar *s, const UChar *sLimit, UErrorCode &errorCode) {
    if(s==sLimit) {
        return TRUE;
    }
    int32_t length=(int32_t)(sLimit-s);
    if(remainingCapacity<length && !resize(length, errorCode)) {
        return FALSE;
    }
    u_memcpy(limit, s, length);
    limit+=length;
    remainingCapacity-=length;
    lastCC=0;
    reorderStart=limit;
    return TRUE;
}